

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O0

int cfg_tobin_bitmap256(void *reference,size_t bin_size,const_strarray *value)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  size_t sVar4;
  bool bVar5;
  char *pcStack_38;
  int idx;
  char *ptr;
  bitmap256 *bitmap;
  const_strarray *value_local;
  size_t bin_size_local;
  void *reference_local;
  
  if (bin_size == 0x20) {
    memset(reference,0,0x20);
    pcStack_38 = value->value;
    while( true ) {
      bVar5 = false;
      if (pcStack_38 != (char *)0x0) {
        bVar5 = pcStack_38 < value->value + value->length;
      }
      if (!bVar5) break;
      piVar2 = __errno_location();
      *piVar2 = 0;
      iVar1 = strcasecmp(pcStack_38,"all");
      if (iVar1 == 0) {
        memset(reference,0xff,0x20);
      }
      else {
        iVar1 = strcasecmp(pcStack_38,"none");
        if (iVar1 == 0) {
          memset(reference,0,0x20);
        }
        else if (*pcStack_38 == '-') {
          lVar3 = strtol(pcStack_38 + 1,(char **)0x0,10);
          piVar2 = __errno_location();
          if (*piVar2 == 0) {
            bitmap256_reset((bitmap256 *)reference,(uint8_t)lVar3);
          }
        }
        else {
          lVar3 = strtol(pcStack_38,(char **)0x0,10);
          piVar2 = __errno_location();
          if (*piVar2 == 0) {
            bitmap256_set((bitmap256 *)reference,(uint8_t)lVar3);
          }
        }
      }
      sVar4 = strlen(pcStack_38);
      pcStack_38 = pcStack_38 + sVar4 + 1;
    }
    reference_local._4_4_ = 0;
  }
  else {
    reference_local._4_4_ = -1;
  }
  return reference_local._4_4_;
}

Assistant:

int
cfg_tobin_bitmap256(void *reference, size_t bin_size, const struct const_strarray *value) {
  struct bitmap256 *bitmap;
  const char *ptr;
  int idx;

  if (bin_size != sizeof(*bitmap)) {
    return -1;
  }

  bitmap = (struct bitmap256 *)reference;
  memset(bitmap, 0, sizeof(*bitmap));

  strarray_for_each_element(value, ptr) {
    errno = 0;
    if (strcasecmp(ptr, BITMAP256_ALL) == 0) {
      memset(bitmap, 255, sizeof(*bitmap));
    }
    else if (strcasecmp(ptr, BITMAP256_NONE) == 0) {
      memset(bitmap, 0, sizeof(*bitmap));
    }
    else if (*ptr == '-') {
      idx = strtol(&ptr[1], NULL, 10);
      if (!errno) {
        bitmap256_reset(bitmap, idx);
      }
    }
    else {
      idx = strtol(ptr, NULL, 10);
      if (!errno) {
        bitmap256_set(bitmap, idx);
      }
    }
  }
  return 0;
}